

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O2

DdNode * cuddSplitSetRecur(DdManager *manager,st__table *mtable,int *varSeen,DdNode *p,double n,
                          double max,int index)

{
  int index_00;
  int iVar1;
  int *piVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *g;
  byte bVar6;
  ulong uVar7;
  double local_70;
  double local_58;
  double *dummy;
  double local_38;
  
  piVar2 = (int *)((ulong)p & 0xfffffffffffffffe);
  index_00 = *piVar2;
  if ((long)index_00 == 0x7fffffff) {
    pDVar3 = selectMintermsFromUniverse(manager,varSeen,n);
    return pDVar3;
  }
  pDVar3 = manager->one;
  varSeen[manager->invperm[index_00]] = -1;
  pDVar5 = (DdNode *)((ulong)*(DdNode **)(piVar2 + 4) ^ 1);
  pDVar4 = (DdNode *)((ulong)*(DdNode **)(piVar2 + 6) ^ 1);
  if (((ulong)p & 1) == 0) {
    pDVar5 = *(DdNode **)(piVar2 + 4);
    pDVar4 = *(DdNode **)(piVar2 + 6);
  }
  bVar6 = (byte)index;
  if (*(int *)((ulong)pDVar5 & 0xfffffffffffffffe) == 0x7fffffff) {
    if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
      pDVar3 = selectMintermsFromUniverse(manager,varSeen,n);
      if (pDVar3 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar2 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      pDVar4 = cuddBddAndRecur(manager,p,pDVar3);
      if (pDVar4 != (DdNode *)0x0) {
        uVar7 = (ulong)pDVar4 & 0xfffffffffffffffe;
        *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
        goto LAB_006658bc;
      }
      goto LAB_0066595d;
    }
    if (pDVar5 == pDVar3) {
      local_58 = max / (double)(2 << (bVar6 & 0x1f));
      local_38 = n;
      goto LAB_0066579a;
    }
    local_58 = 0.0;
    local_38 = n;
LAB_006657c6:
    iVar1 = st__lookup(mtable,(char *)pDVar4,(char **)&dummy);
    if (iVar1 == 0) {
      return (DdNode *)0x0;
    }
    local_70 = *dummy / (double)(2 << (bVar6 & 0x1f));
  }
  else {
    local_38 = n;
    iVar1 = st__lookup(mtable,(char *)pDVar5,(char **)&dummy);
    if (iVar1 == 0) {
      return (DdNode *)0x0;
    }
    local_58 = *dummy / (double)(2 << (bVar6 & 0x1f));
LAB_0066579a:
    if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) != 0x7fffffff) goto LAB_006657c6;
    if (pDVar4 == pDVar3) {
      local_70 = max / (double)(2 << (bVar6 & 0x1f));
    }
    else {
      local_70 = 0.0;
    }
  }
  pDVar3 = cuddUniqueInter(manager,index_00,pDVar3,(DdNode *)((ulong)pDVar3 ^ 1));
  piVar2 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + 1;
  if ((local_58 == local_38) && (!NAN(local_58) && !NAN(local_38))) {
    pDVar4 = cuddBddAndRecur(manager,pDVar3,pDVar5);
    if (pDVar4 != (DdNode *)0x0) {
      uVar7 = (ulong)pDVar4 & 0xfffffffffffffffe;
      *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
LAB_006658bc:
      Cudd_RecursiveDeref(manager,pDVar3);
      *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + -1;
      return pDVar4;
    }
    goto LAB_0066595d;
  }
  if ((local_70 == local_38) && (!NAN(local_70) && !NAN(local_38))) {
    pDVar4 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar3 ^ 1),pDVar4);
    if (pDVar4 != (DdNode *)0x0) {
      uVar7 = (ulong)pDVar4 & 0xfffffffffffffffe;
      *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
      goto LAB_006658bc;
    }
    goto LAB_0066595d;
  }
  if (local_38 <= local_58) {
    if (local_70 < local_38) {
      g = cuddSplitSetRecur(manager,mtable,varSeen,pDVar5,local_38 - local_70,max,index + 1);
      if (g == (DdNode *)0x0) goto LAB_0066595d;
      piVar2 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      pDVar5 = cuddBddIteRecur(manager,pDVar3,g,pDVar4);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(manager,g);
        goto LAB_0066595d;
      }
      uVar7 = (ulong)pDVar5 & 0xfffffffffffffffe;
      *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
      Cudd_RecursiveDeref(manager,g);
      goto LAB_006659ff;
    }
    if (*(int *)((ulong)pDVar5 & 0xfffffffffffffffe) == 0x7fffffff) {
      if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
LAB_00665ab3:
        if (local_70 <= local_58) {
          pDVar5 = pDVar4;
        }
        pDVar4 = cuddSplitSetRecur(manager,mtable,varSeen,pDVar5,local_38,max,index + 1);
        if (pDVar4 != (DdNode *)0x0) {
          piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          pDVar5 = (DdNode *)((ulong)pDVar3 ^ 1);
          if (local_58 < local_70) {
            pDVar5 = pDVar3;
          }
          pDVar5 = cuddBddAndRecur(manager,pDVar5,pDVar4);
          if (pDVar5 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,pDVar4);
            goto LAB_0066595d;
          }
          uVar7 = (ulong)pDVar5 & 0xfffffffffffffffe;
          *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
          Cudd_RecursiveDeref(manager,pDVar4);
          goto LAB_006659ff;
        }
        goto LAB_0066595d;
      }
      pDVar4 = selectMintermsFromUniverse(manager,varSeen,local_38);
      if (pDVar4 == (DdNode *)0x0) goto LAB_0066595d;
      piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      pDVar5 = pDVar3;
    }
    else {
      if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) != 0x7fffffff) goto LAB_00665ab3;
      pDVar4 = selectMintermsFromUniverse(manager,varSeen,local_38);
      if (pDVar4 == (DdNode *)0x0) goto LAB_0066595d;
      piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      pDVar5 = (DdNode *)((ulong)pDVar3 ^ 1);
    }
    pDVar5 = cuddBddAndRecur(manager,pDVar5,pDVar4);
  }
  else {
    pDVar4 = cuddSplitSetRecur(manager,mtable,varSeen,pDVar4,local_38 - local_58,max,index + 1);
    if (pDVar4 == (DdNode *)0x0) goto LAB_0066595d;
    piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar2 = *piVar2 + 1;
    pDVar5 = cuddBddIteRecur(manager,pDVar3,pDVar5,pDVar4);
  }
  if (pDVar5 != (DdNode *)0x0) {
    uVar7 = (ulong)pDVar5 & 0xfffffffffffffffe;
    *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
    Cudd_RecursiveDeref(manager,pDVar4);
LAB_006659ff:
    Cudd_RecursiveDeref(manager,pDVar3);
    *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + -1;
    return pDVar5;
  }
  Cudd_RecursiveDeref(manager,pDVar4);
LAB_0066595d:
  Cudd_RecursiveDeref(manager,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode*
cuddSplitSetRecur(
  DdManager * manager,
  st__table * mtable,
  int * varSeen,
  DdNode * p,
  double  n,
  double  max,
  int  index)
{
    DdNode *one, *zero, *N, *Nv;
    DdNode *Nnv, *q, *r, *v;
    DdNode *result;
    double *dummy, numT, numE;
    int variable, positive;
  
    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* If p is constant, extract n minterms from constant 1.  The procedure by
    ** construction guarantees that minterms will not be extracted from
    ** constant 0.
    */
    if (Cudd_IsConstant(p)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        return(q);
    }

    N = Cudd_Regular(p);

    /* Set variable as seen. */
    variable = N->index;
    varSeen[manager->invperm[variable]] = -1;

    Nv = cuddT(N);
    Nnv = cuddE(N);
    if (Cudd_IsComplement(p)) {
        Nv = Cudd_Not(Nv);
        Nnv = Cudd_Not(Nnv);
    }

    /* If both the children of 'p' are constants, extract n minterms from a
    ** constant node.
    */
    if (Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddAndRecur(manager,p,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        cuddDeref(r);
        return(r);
    }
  
    /* Lookup the # of minterms in the onset of the node from the table. */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mtable, (const char *)Nv, (char **)&dummy)) return(NULL);
        numT = *dummy/(2*(1<<index));
    } else if (Nv == one) {
        numT = max/(2*(1<<index));
    } else {
        numT = 0;
    }
  
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mtable, (const char *)Nnv, (char **)&dummy)) return(NULL);
        numE = *dummy/(2*(1<<index));
    } else if (Nnv == one) {
        numE = max/(2*(1<<index));
    } else {
        numE = 0;
    }

    v = cuddUniqueInter(manager,variable,one,zero);
    cuddRef(v);

    /* If perfect match. */
    if (numT == n) {
        q = cuddBddAndRecur(manager,v,Nv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    if (numE == n) {
        q = cuddBddAndRecur(manager,Cudd_Not(v),Nnv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    /* If n is greater than numT, extract the difference from the ELSE child
    ** and retain the function represented by the THEN branch.
    */
    if (numT < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,(n-numT),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,Nv,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);
        return(r);
    }
    /* If n is greater than numE, extract the difference from the THEN child
    ** and retain the function represented by the ELSE branch.
    */
    if (numE < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv, (n-numE),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,q,Nnv);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);    
        return(r);
    }

    /* None of the above cases; (n < numT and n < numE) and either of
    ** the Nv, Nnv or both are not constants. If possible extract the
    ** required minterms the constant branch.
    */
    if (Cudd_IsConstant(Nv) && !Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,v,q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    } else if (!Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    }

    /* Both Nv and Nnv are not constants. So choose the one which
    ** has fewer minterms in its onset.
    */
    positive = 0;
    if (numT < numE) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv,n,max,index+1);
        positive = 1;
    } else {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,n,max,index+1);
    }

    if (q == NULL) {
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(q);

    if (positive) {
        result = cuddBddAndRecur(manager,v,q);
    } else {
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
    }
    if (result == NULL) {
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(result);
    Cudd_RecursiveDeref(manager,q);
    Cudd_RecursiveDeref(manager,v);
    cuddDeref(result);

    return(result);

}